

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

AssertionResult __thiscall
testing::internal::CmpHelperEQ<wchar_t[5],fmt::v5::basic_string_view<wchar_t>>
          (internal *this,char *expected_expression,char *actual_expression,wchar_t (*expected) [5],
          basic_string_view<wchar_t> *actual)

{
  ulong uVar1;
  int iVar2;
  size_t sVar3;
  ulong __n;
  void **extraout_RDX;
  void **value;
  basic_string_view<wchar_t> *value_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_01;
  bool bVar5;
  AssertionResult AVar6;
  string local_70;
  string local_50;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar4
  ;
  
  sVar3 = wcslen(*expected);
  uVar1 = actual->size_;
  __n = uVar1;
  if (sVar3 < uVar1) {
    __n = sVar3;
  }
  if (__n == 0) {
    bVar5 = true;
    value = (void **)0x0;
  }
  else {
    iVar2 = wmemcmp(*expected,actual->data_,__n);
    bVar5 = iVar2 == 0;
    value = extraout_RDX;
  }
  if ((sVar3 == uVar1) && (bVar5)) {
    AVar6 = AssertionSuccess();
    sVar4 = AVar6.message_.ptr_;
  }
  else {
    local_70._M_dataplus._M_p = (pointer)expected;
    PrintToString<void_const*>(&local_50,(testing *)&local_70,value);
    PrintToString<fmt::v5::basic_string_view<wchar_t>>(&local_70,(testing *)actual,value_00);
    AVar6 = EqFailure(this,expected_expression,actual_expression,&local_50,&local_70,false);
    sVar4 = AVar6.message_.ptr_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
      sVar4.ptr_ = extraout_RDX_00;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
      sVar4.ptr_ = extraout_RDX_01;
    }
  }
  AVar6.message_.ptr_ = sVar4.ptr_;
  AVar6._0_8_ = this;
  return AVar6;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4389)  // Temporarily disables warning on
                                // signed/unsigned mismatch.
#endif

  if (expected == actual) {
    return AssertionSuccess();
  }

#ifdef _MSC_VER
# pragma warning(pop)          // Restores the warning state.
#endif

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}